

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

size_t __thiscall
pstore::file::file_base::read_span<pstore::gsl::span<char,_1l>,void>
          (file_base *this,span<char,__1L> *s)

{
  int iVar1;
  pointer t;
  index_type iVar2;
  undefined4 extraout_var;
  not_null<void_*> local_28;
  index_type local_20;
  index_type size;
  span<char,__1L> *s_local;
  file_base *this_local;
  
  size = (index_type)s;
  s_local = (span<char,__1L> *)this;
  local_20 = gsl::span<char,_-1L>::size_bytes(s);
  if (-1 < local_20) {
    t = gsl::span<char,_-1L>::data((span<char,__1L> *)size);
    gsl::not_null<void_*>::not_null(&local_28,t);
    iVar2 = gsl::span<char,_-1L>::size_bytes((span<char,__1L> *)size);
    iVar1 = (*this->_vptr_file_base[0xd])(this,local_28.ptr_,iVar2);
    return CONCAT44(extraout_var,iVar1);
  }
  assert_failed("size >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/os/file.hpp"
                ,0xde);
}

Assistant:

std::size_t read_span (SpanType const & s) {
                auto const size = s.size_bytes ();
                PSTORE_ASSERT (size >= 0);
                using utype = typename std::make_unsigned<decltype (size)>::type;
                return this->read_buffer (s.data (), static_cast<utype> (s.size_bytes ()));
            }